

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O3

vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *
computeIntersections
          (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
           *__return_storage_ptr__,vector<Node,_std::allocator<Node>_> *nodes,
          vector<bool,_std::allocator<bool>_> *removed)

{
  _Bit_type *p_Var1;
  bool bVar2;
  pointer pNVar3;
  ulong uVar4;
  pointer pNVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer local_60;
  Node *local_58;
  ulong local_50;
  ulong local_48;
  vector<Node,_std::allocator<Node>_> *local_40;
  vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar3 = (nodes->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pNVar5 = (nodes->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_38 = (vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
             __return_storage_ptr__;
  if (pNVar5 != pNVar3) {
    uVar7 = 0;
    local_48 = 0x800000000000003f;
    local_40 = nodes;
    do {
      p_Var1 = (removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if (((long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) *
          8 + (ulong)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
        if (uVar7 != 0) {
LAB_001015cd:
          lVar6 = 0;
          uVar8 = 0;
          local_50 = uVar7;
          do {
            p_Var1 = (removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if (((long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)p_Var1) * 8 +
                (ulong)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
LAB_00101628:
              pNVar3 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              bVar2 = quadtree::Box<float>::intersects
                                (&pNVar3[uVar7].box,
                                 (Box<float> *)((long)&(pNVar3->box).left + lVar6));
              if (bVar2) {
                pNVar3 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                local_60 = pNVar3 + uVar7;
                local_58 = (Node *)((long)&(pNVar3->box).left + lVar6);
                std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
                emplace_back<Node*,Node*>(local_38,&local_60,&local_58);
              }
            }
            else {
              uVar4 = uVar8 + 0x3f;
              if (-1 < (long)uVar8) {
                uVar4 = uVar8;
              }
              if ((p_Var1[((long)uVar4 >> 6) +
                          (ulong)((uVar8 & local_48) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   (uVar8 & 0x3f) & 1) == 0) goto LAB_00101628;
            }
            uVar8 = uVar8 + 1;
            lVar6 = lVar6 + 0x18;
          } while (uVar7 + (uVar7 == 0) != uVar8);
          pNVar3 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar5 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar7 = local_50;
        }
      }
      else {
        uVar8 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar8 = uVar7;
        }
        if ((p_Var1[((long)uVar8 >> 6) +
                    (ulong)((uVar7 & local_48) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar7 & 0x3f) & 1) == 0 && uVar7 != 0) goto LAB_001015cd;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)pNVar5 - (long)pNVar3 >> 3) * -0x5555555555555555));
  }
  return (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)local_38;
}

Assistant:

std::vector<std::pair<Node*, Node*>> computeIntersections(std::vector<Node>& nodes, const std::vector<bool>& removed)
{
    auto intersections = std::vector<std::pair<Node*, Node*>>();
    for (auto i = std::size_t(0); i < nodes.size(); ++i)
    {
        if (removed.size() == 0 || !removed[i])
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (removed.size() == 0 || !removed[j])
                {
                    if (nodes[i].box.intersects(nodes[j].box))
                        intersections.emplace_back(&nodes[i], &nodes[j]);
                }
            }
        }
    }
    return intersections;
}